

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O3

void base_unmap(tsdn_t *tsdn,ehooks_t *ehooks,uint ind,void *addr,size_t size)

{
  int8_t *piVar1;
  extent_hooks_t *peVar2;
  _Bool _Var3;
  bool bVar4;
  char cVar5;
  tsd_t *ptVar6;
  undefined4 in_register_00000014;
  void *addr_00;
  
  addr_00 = (void *)CONCAT44(in_register_00000014,ind);
  if ((extent_hooks_t *)(ehooks->ptr).repr == &duckdb_je_ehooks_default_extent_hooks) {
    _Var3 = duckdb_je_extent_dalloc_mmap(addr_00,(size_t)addr);
    if (((_Var3) && (_Var3 = duckdb_je_pages_decommit(addr_00,(size_t)addr), _Var3)) &&
       (_Var3 = duckdb_je_pages_purge_forced(addr_00,(size_t)addr), _Var3)) {
      duckdb_je_pages_purge_lazy(addr_00,(size_t)addr);
    }
    goto LAB_01c343cf;
  }
  peVar2 = (extent_hooks_t *)(ehooks->ptr).repr;
  if (peVar2 == &duckdb_je_ehooks_default_extent_hooks) {
    bVar4 = duckdb_je_ehooks_default_dalloc_impl(addr_00,(size_t)addr);
joined_r0x01c3419e:
    if (!bVar4) goto LAB_01c343cf;
  }
  else if (peVar2->dalloc != (extent_dalloc_t *)0x0) {
    ptVar6 = &tsdn->tsd;
    if ((tsdn == (tsdn_t *)0x0) &&
       (ptVar6 = (tsd_t *)__tls_get_addr(&PTR_02493488), (ptVar6->state).repr != '\0')) {
      ptVar6 = duckdb_je_tsd_fetch_slow(ptVar6,false);
    }
    ptVar6->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level =
         ptVar6->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level + '\x01';
    if ((ptVar6->state).repr == '\0') {
      duckdb_je_tsd_slow_update(ptVar6);
    }
    bVar4 = (*peVar2->dalloc)(peVar2,addr_00,(size_t)addr,true,ehooks->ind);
    ptVar6 = &tsdn->tsd;
    if ((tsdn == (tsdn_t *)0x0) &&
       (ptVar6 = (tsd_t *)__tls_get_addr(&PTR_02493488), (ptVar6->state).repr != '\0')) {
      ptVar6 = duckdb_je_tsd_fetch_slow(ptVar6,false);
    }
    piVar1 = &ptVar6->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == '\0') {
      duckdb_je_tsd_slow_update(ptVar6);
    }
    goto joined_r0x01c3419e;
  }
  peVar2 = (extent_hooks_t *)(ehooks->ptr).repr;
  if (peVar2 == &duckdb_je_ehooks_default_extent_hooks) {
    _Var3 = duckdb_je_ehooks_default_decommit_impl(addr_00,0,(size_t)addr);
    if (!_Var3) goto LAB_01c343cf;
  }
  else if (peVar2->decommit != (undefined1 *)0x0) {
    ptVar6 = &tsdn->tsd;
    if ((tsdn == (tsdn_t *)0x0) &&
       (ptVar6 = (tsd_t *)__tls_get_addr(&PTR_02493488), (ptVar6->state).repr != '\0')) {
      ptVar6 = duckdb_je_tsd_fetch_slow(ptVar6,false);
    }
    ptVar6->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level =
         ptVar6->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level + '\x01';
    if ((ptVar6->state).repr == '\0') {
      duckdb_je_tsd_slow_update(ptVar6);
    }
    cVar5 = (*(code *)peVar2->decommit)(peVar2,addr_00,addr,0,addr,ehooks->ind);
    ptVar6 = &tsdn->tsd;
    if ((tsdn == (tsdn_t *)0x0) &&
       (ptVar6 = (tsd_t *)__tls_get_addr(&PTR_02493488), (ptVar6->state).repr != '\0')) {
      ptVar6 = duckdb_je_tsd_fetch_slow(ptVar6,false);
    }
    piVar1 = &ptVar6->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == '\0') {
      duckdb_je_tsd_slow_update(ptVar6);
    }
    if (cVar5 == '\0') goto LAB_01c343cf;
  }
  peVar2 = (extent_hooks_t *)(ehooks->ptr).repr;
  if (peVar2 == &duckdb_je_ehooks_default_extent_hooks) {
    _Var3 = duckdb_je_ehooks_default_purge_forced_impl(addr_00,0,(size_t)addr);
    if (!_Var3) goto LAB_01c343cf;
  }
  else if (peVar2->purge_forced != (undefined1 *)0x0) {
    ptVar6 = &tsdn->tsd;
    if ((tsdn == (tsdn_t *)0x0) &&
       (ptVar6 = (tsd_t *)__tls_get_addr(&PTR_02493488), (ptVar6->state).repr != '\0')) {
      ptVar6 = duckdb_je_tsd_fetch_slow(ptVar6,false);
    }
    ptVar6->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level =
         ptVar6->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level + '\x01';
    if ((ptVar6->state).repr == '\0') {
      duckdb_je_tsd_slow_update(ptVar6);
    }
    cVar5 = (*(code *)peVar2->purge_forced)(peVar2,addr_00,addr,0,addr,ehooks->ind);
    ptVar6 = &tsdn->tsd;
    if ((tsdn == (tsdn_t *)0x0) &&
       (ptVar6 = (tsd_t *)__tls_get_addr(&PTR_02493488), (ptVar6->state).repr != '\0')) {
      ptVar6 = duckdb_je_tsd_fetch_slow(ptVar6,false);
    }
    piVar1 = &ptVar6->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == '\0') {
      duckdb_je_tsd_slow_update(ptVar6);
    }
    if (cVar5 == '\0') goto LAB_01c343cf;
  }
  peVar2 = (extent_hooks_t *)(ehooks->ptr).repr;
  if (peVar2 == &duckdb_je_ehooks_default_extent_hooks) {
    duckdb_je_ehooks_default_purge_lazy_impl(addr_00,0,(size_t)addr);
  }
  else if (peVar2->purge_lazy != (undefined1 *)0x0) {
    ptVar6 = &tsdn->tsd;
    if ((tsdn == (tsdn_t *)0x0) &&
       (ptVar6 = (tsd_t *)__tls_get_addr(&PTR_02493488), (ptVar6->state).repr != '\0')) {
      ptVar6 = duckdb_je_tsd_fetch_slow(ptVar6,false);
    }
    ptVar6->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level =
         ptVar6->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level + '\x01';
    if ((ptVar6->state).repr == '\0') {
      duckdb_je_tsd_slow_update(ptVar6);
    }
    (*(code *)peVar2->purge_lazy)(peVar2,addr_00,addr,0,addr,ehooks->ind);
    if ((tsdn == (tsdn_t *)0x0) &&
       (tsdn = (tsdn_t *)__tls_get_addr(&PTR_02493488), (((tsd_t *)tsdn)->state).repr != '\0')) {
      tsdn = (tsdn_t *)duckdb_je_tsd_fetch_slow((tsd_t *)tsdn,false);
    }
    piVar1 = &(tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == '\0') {
      duckdb_je_tsd_slow_update(&tsdn->tsd);
    }
  }
LAB_01c343cf:
  if ((duckdb_je_opt_metadata_thp != metadata_thp_disabled) &&
     (duckdb_je_init_system_thp_mode == thp_mode_default)) {
    duckdb_je_pages_nohuge(addr_00,(size_t)addr);
    return;
  }
  return;
}

Assistant:

static void
base_unmap(tsdn_t *tsdn, ehooks_t *ehooks, unsigned ind, void *addr,
    size_t size) {
	/*
	 * Cascade through dalloc, decommit, purge_forced, and purge_lazy,
	 * stopping at first success.  This cascade is performed for consistency
	 * with the cascade in extent_dalloc_wrapper() because an application's
	 * custom hooks may not support e.g. dalloc.  This function is only ever
	 * called as a side effect of arena destruction, so although it might
	 * seem pointless to do anything besides dalloc here, the application
	 * may in fact want the end state of all associated virtual memory to be
	 * in some consistent-but-allocated state.
	 */
	if (ehooks_are_default(ehooks)) {
		if (!extent_dalloc_mmap(addr, size)) {
			goto label_done;
		}
		if (!pages_decommit(addr, size)) {
			goto label_done;
		}
		if (!pages_purge_forced(addr, size)) {
			goto label_done;
		}
		if (!pages_purge_lazy(addr, size)) {
			goto label_done;
		}
		/* Nothing worked.  This should never happen. */
		not_reached();
	} else {
		if (!ehooks_dalloc(tsdn, ehooks, addr, size, true)) {
			goto label_done;
		}
		if (!ehooks_decommit(tsdn, ehooks, addr, size, 0, size)) {
			goto label_done;
		}
		if (!ehooks_purge_forced(tsdn, ehooks, addr, size, 0, size)) {
			goto label_done;
		}
		if (!ehooks_purge_lazy(tsdn, ehooks, addr, size, 0, size)) {
			goto label_done;
		}
		/* Nothing worked.  That's the application's problem. */
	}
label_done:
	if (metadata_thp_madvise()) {
		/* Set NOHUGEPAGE after unmap to avoid kernel defrag. */
		assert(((uintptr_t)addr & HUGEPAGE_MASK) == 0 &&
		    (size & HUGEPAGE_MASK) == 0);
		pages_nohuge(addr, size);
	}
}